

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_api.c
# Opt level: O0

pcp_flow_t *
pcp_learn_dscp(pcp_ctx_t *ctx,uint8_t delay_tol,uint8_t loss_tol,uint8_t jitter_tol,char *app_name)

{
  undefined1 *local_b0;
  caasi_data data;
  flow_key_data kd;
  char *app_name_local;
  uint8_t jitter_tol_local;
  uint8_t loss_tol_local;
  uint8_t delay_tol_local;
  pcp_ctx_t *ctx_local;
  
  memset(&local_b0,0,0x40);
  memset((void *)((long)&data.userdata + 4),0,0x4c);
  data.userdata._4_1_ = 3;
  data.kd = (flow_key_data *)0x0;
  local_b0 = (undefined1 *)((long)&data.userdata + 4);
  data.fprev = (pcp_flow_t *)0x0;
  data.ffirst._0_4_ = 0;
  data.lifetime = 0;
  data._28_4_ = 0;
  data.ext_addr._0_1_ = delay_tol << 6 | (loss_tol & 3) << 4 | (jitter_tol & 3) << 2;
  data._40_8_ = app_name;
  pcp_db_foreach_server(ctx,chain_and_assign_src_ip,&local_b0);
  return data.fprev;
}

Assistant:

pcp_flow_t *pcp_learn_dscp(pcp_ctx_t *ctx, uint8_t delay_tol, uint8_t loss_tol,
                           uint8_t jitter_tol, char *app_name) {
    struct flow_key_data kd;
    struct caasi_data data;

    memset(&data, 0, sizeof(data));
    memset(&kd, 0, sizeof(kd));

    kd.operation = PCP_OPCODE_SADSCP;

    data.fprev = NULL;
    data.kd = &kd;
    data.ffirst = NULL;
    data.lifetime = 0;
    data.ext_addr = NULL;
    data.toler_fields =
        (delay_tol & 3) << 6 | ((loss_tol & 3) << 4) | ((jitter_tol & 3) << 2);
    data.app_name = app_name;

    pcp_db_foreach_server(ctx, chain_and_assign_src_ip, &data);

    return data.ffirst;
}